

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O3

int Sfm_ObjMffcSize(Sfm_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  if (p->nPis <= iObj) {
    if ((iObj < 0) || ((p->vFanouts).nSize <= iObj)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    iVar1 = 0;
    if ((p->vFanouts).pArray[(uint)iObj].nSize == 1) {
      if (p->nObjs <= p->nPos + iObj) {
        __assert_fail("Sfm_ObjIsNode( p, iObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmWin.c"
                      ,0x60,"int Sfm_ObjMffcSize(Sfm_Ntk_t *, int)");
      }
      iVar1 = Sfm_ObjDeref(p,iObj);
      iVar2 = Sfm_ObjRef(p,iObj);
      if (iVar1 != iVar2) {
        __assert_fail("Count1 == Count2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmWin.c"
                      ,99,"int Sfm_ObjMffcSize(Sfm_Ntk_t *, int)");
      }
    }
  }
  return iVar1;
}

Assistant:

int Sfm_ObjMffcSize( Sfm_Ntk_t * p, int iObj )
{
    int Count1, Count2;
    if ( Sfm_ObjIsPi(p, iObj) )
        return 0;
    if ( Sfm_ObjFanoutNum(p, iObj) != 1 )
        return 0;
    assert( Sfm_ObjIsNode( p, iObj ) );
    Count1 = Sfm_ObjDeref( p, iObj );
    Count2 = Sfm_ObjRef( p, iObj );
    assert( Count1 == Count2 );
    return Count1;
}